

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

Promise<void> __thiscall
kj::anon_unknown_36::WebSocketPipeImpl::pumpTo(WebSocketPipeImpl *this,WebSocket *other)

{
  SourceLocation location;
  long *in_RDX;
  SourceLocation local_68;
  undefined1 local_50 [32];
  Promise<void> local_30;
  Promise<void> local_28;
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_c__:3918:45),_void>
  onAbort;
  WebSocket *other_local;
  WebSocketPipeImpl *this_local;
  
  (**(code **)(*in_RDX + 0x28))();
  Promise<void>::
  then<kj::(anonymous_namespace)::WebSocketPipeImpl::pumpTo(kj::WebSocket&)::_lambda()_1_>
            (&local_28,(Type *)&local_30);
  Promise<void>::~Promise(&local_30);
  pumpToNoAbort((WebSocketPipeImpl *)local_50,other);
  mv<kj::Promise<void>>(&local_28);
  SourceLocation::SourceLocation
            (&local_68,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
             ,"pumpTo",0xf52,0xc);
  location.function = local_68.function;
  location.fileName = local_68.fileName;
  location.lineNumber = local_68.lineNumber;
  location.columnNumber = local_68.columnNumber;
  Promise<void>::exclusiveJoin((Promise<void> *)this,(Promise<void> *)local_50,location);
  Promise<void>::~Promise((Promise<void> *)local_50);
  Promise<void>::~Promise(&local_28);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> pumpTo(WebSocket& other) override {
    auto onAbort = other.whenAborted().then([]() -> kj::Promise<void> {
      return KJ_EXCEPTION(DISCONNECTED, "WebSocket was aborted");
    });

    return pumpToNoAbort(other).exclusiveJoin(kj::mv(onAbort));
  }